

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

xmlSchemaWildcardNsPtr xmlSchemaNewWildcardNsConstraint(xmlSchemaParserCtxtPtr ctxt)

{
  xmlSchemaWildcardNsPtr pxVar1;
  
  pxVar1 = (xmlSchemaWildcardNsPtr)(*xmlMalloc)(0x10);
  if (pxVar1 == (xmlSchemaWildcardNsPtr)0x0) {
    xmlSchemaPErrMemory(ctxt,"creating wildcard namespace constraint",(xmlNodePtr)0x0);
  }
  else {
    pxVar1->next = (_xmlSchemaWildcardNs *)0x0;
    pxVar1->value = (xmlChar *)0x0;
  }
  return pxVar1;
}

Assistant:

static xmlSchemaWildcardNsPtr
xmlSchemaNewWildcardNsConstraint(xmlSchemaParserCtxtPtr ctxt)
{
    xmlSchemaWildcardNsPtr ret;

    ret = (xmlSchemaWildcardNsPtr)
	xmlMalloc(sizeof(xmlSchemaWildcardNs));
    if (ret == NULL) {
	xmlSchemaPErrMemory(ctxt, "creating wildcard namespace constraint", NULL);
	return (NULL);
    }
    ret->value = NULL;
    ret->next = NULL;
    return (ret);
}